

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_for_testing.hpp
# Opt level: O0

void HelpersForTests::noise_bitstring_inplace<bool,6144ul>
               (array<bool,_6144UL> *src,double err_prob,uint seed)

{
  value_type_conflict1 vVar1;
  result_type_conflict rVar2;
  size_type sVar3;
  reference pvVar4;
  ulong local_9f8;
  size_t i;
  bernoulli_distribution distribution;
  mt19937_64 rng;
  uint seed_local;
  double err_prob_local;
  array<bool,_6144UL> *src_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&distribution,(ulong)seed);
  std::bernoulli_distribution::bernoulli_distribution((bernoulli_distribution *)&i,err_prob);
  local_9f8 = 0;
  while( true ) {
    sVar3 = std::array<bool,_6144UL>::size(src);
    if (sVar3 <= local_9f8) break;
    rVar2 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)&i,
                       (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)&distribution);
    if (rVar2) {
      pvVar4 = std::array<bool,_6144UL>::operator[](src,local_9f8);
      vVar1 = *pvVar4;
      pvVar4 = std::array<bool,_6144UL>::operator[](src,local_9f8);
      *pvVar4 = (value_type_conflict1)((vVar1 ^ 0xffU) & 1);
    }
    else {
      pvVar4 = std::array<bool,_6144UL>::operator[](src,local_9f8);
      vVar1 = *pvVar4;
      pvVar4 = std::array<bool,_6144UL>::operator[](src,local_9f8);
      *pvVar4 = (value_type_conflict1)(vVar1 & 1);
    }
    local_9f8 = local_9f8 + 1;
  }
  return;
}

Assistant:

void noise_bitstring_inplace(std::array<T, N> &src, double err_prob, unsigned int seed = 0) {
        std::mt19937_64 rng{seed}; // hard-coded seed for testing purposes.

        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }